

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

void Cba_NtkInsertGroup(Cba_Ntk_t *p,Vec_Int_t *vObjs,Cba_Ntk_t *pSyn)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *__ptr;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  
  pVVar6 = Cba_NtkCollectInFons(p,vObjs);
  __ptr = Cba_NtkCollectOutFons(p,vObjs);
  uVar5 = (pSyn->vInputs).nSize;
  if (uVar5 != pVVar6->nSize) {
    __assert_fail("Cba_NtkPiNum(pSyn) == Vec_IntSize(vFonIns)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x45a,"void Cba_NtkInsertGroup(Cba_Ntk_t *, Vec_Int_t *, Cba_Ntk_t *)");
  }
  uVar1 = (pSyn->vOutputs).nSize;
  if (uVar1 != __ptr->nSize) {
    __assert_fail("Cba_NtkPoNum(pSyn) == Vec_IntSize(vFonOuts)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x45b,"void Cba_NtkInsertGroup(Cba_Ntk_t *, Vec_Int_t *, Cba_Ntk_t *)");
  }
  uVar2 = (pSyn->vFonObj).nCap;
  if ((pSyn->vFonCopy).nCap < (int)uVar2) {
    piVar7 = (pSyn->vFonCopy).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar2 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar2 << 2);
    }
    (pSyn->vFonCopy).pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_0033a6dd;
    (pSyn->vFonCopy).nCap = uVar2;
  }
  if (0 < (int)uVar2) {
    memset((pSyn->vFonCopy).pArray,0,(ulong)uVar2 * 4);
  }
  (pSyn->vFonCopy).nSize = uVar2;
  if ((pSyn->vInputs).nSize < 1) {
    piVar7 = pVVar6->pArray;
    if (piVar7 != (int *)0x0) goto LAB_00339f93;
  }
  else {
    piVar3 = (pSyn->vInputs).pArray;
    uVar9 = 0;
    uVar12 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar12 = uVar9;
    }
    do {
      iVar11 = piVar3[uVar9];
      if ((long)iVar11 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x155,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if (((pSyn->vObjFon0).nSize <= iVar11) || (uVar12 == uVar9)) goto LAB_0033a526;
      uVar5 = (pSyn->vObjFon0).pArray[iVar11];
      if ((int)uVar5 < 1) goto LAB_0033a545;
      if ((pSyn->vFonCopy).nSize <= (int)uVar5) goto LAB_0033a526;
      piVar4 = (pSyn->vFonCopy).pArray;
      if (piVar4[uVar5] != 0) goto LAB_0033a54e;
      piVar7 = pVVar6->pArray;
      piVar4[uVar5] = piVar7[uVar9];
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)(pSyn->vInputs).nSize);
LAB_00339f93:
    free(piVar7);
  }
  free(pVVar6);
  uVar5 = (pSyn->vObjType).nCap;
  if ((pSyn->vObjCopy).nCap < (int)uVar5) {
    piVar7 = (pSyn->vObjCopy).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar5 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar5 << 2);
    }
    (pSyn->vObjCopy).pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_0033a6dd;
    (pSyn->vObjCopy).nCap = uVar5;
  }
  if (0 < (int)uVar5) {
    memset((pSyn->vObjCopy).pArray,0xff,(ulong)uVar5 * 4);
  }
  (pSyn->vObjCopy).nSize = uVar5;
  iVar11 = (pSyn->vObjType).nSize;
  if (1 < iVar11) {
    lVar16 = 1;
    do {
      lVar10 = (long)iVar11;
      if (lVar10 <= lVar16) goto LAB_0033a5f2;
      if (0xffffffa8 < (byte)(pSyn->vObjType).pArray[lVar16] - 0x5a) {
        uVar5 = Cba_ObjDup(p,pSyn,(int)lVar16);
        lVar10 = (long)(pSyn->vObjFon0).nSize;
        if ((lVar10 <= lVar16) || (lVar10 <= lVar16 + 1)) goto LAB_0033a526;
        piVar7 = (pSyn->vObjFon0).pArray;
        uVar2 = piVar7[lVar16];
        uVar12 = (ulong)uVar2;
        iVar11 = 0;
        while ((int)uVar12 < piVar7[lVar16 + 1]) {
          if ((int)uVar5 < 1) {
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                          ,0x157,"int Cba_ObjFon(Cba_Ntk_t *, int, int)");
          }
          if ((p->vObjFon0).nSize <= (int)uVar5) goto LAB_0033a526;
          if ((int)uVar2 < 1) goto LAB_0033a545;
          if ((pSyn->vFonCopy).nSize <= (int)uVar12) goto LAB_0033a526;
          piVar3 = (pSyn->vFonCopy).pArray;
          if (piVar3[uVar12] != 0) goto LAB_0033a54e;
          piVar3[uVar12] = (p->vObjFon0).pArray[uVar5] + iVar11;
          uVar12 = uVar12 + 1;
          iVar11 = iVar11 + 1;
          if ((long)(pSyn->vObjFon0).nSize <= lVar16 + 1) goto LAB_0033a526;
        }
        iVar11 = (pSyn->vObjType).nSize;
        lVar10 = (long)iVar11;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < lVar10);
    if (1 < iVar11) {
      lVar16 = 1;
      do {
        lVar10 = (long)iVar11;
        if (lVar10 <= lVar16) {
LAB_0033a5f2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        if (0xffffffa8 < (byte)(pSyn->vObjType).pArray[lVar16] - 0x5a) {
          if ((pSyn->vObjCopy).nSize < 1) {
            __assert_fail("Cba_NtkHasObjCopies(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                          ,0x15b,"int Cba_ObjCopy(Cba_Ntk_t *, int)");
          }
          lVar10 = lVar16 + 1;
          Vec_IntFillExtra(&pSyn->vObjCopy,(int)lVar10,-1);
          if ((((pSyn->vObjCopy).nSize <= lVar16) ||
              (lVar8 = (long)(pSyn->vObjFin0).nSize, lVar8 <= lVar16)) || (lVar8 <= lVar10))
          goto LAB_0033a526;
          uVar5 = (pSyn->vObjCopy).pArray[lVar16];
          piVar7 = (pSyn->vObjFin0).pArray;
          uVar2 = piVar7[lVar16];
          uVar12 = (ulong)uVar2;
          iVar11 = 0;
          while ((int)uVar12 < piVar7[lVar16 + 1]) {
            if ((int)uVar2 < 1) goto LAB_0033a56d;
            if ((pSyn->vFinFon).nSize <= (int)uVar12) goto LAB_0033a526;
            iVar14 = (pSyn->vFinFon).pArray[uVar12];
            if (0 < (long)iVar14) {
              if ((pSyn->vFonCopy).nSize <= iVar14) goto LAB_0033a526;
              iVar14 = (pSyn->vFonCopy).pArray[iVar14];
            }
            if ((int)uVar5 < 1) {
              pcVar13 = "i>0";
LAB_0033a5bb:
              __assert_fail(pcVar13,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                            ,0x16e,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
            }
            if ((p->vObjFin0).nSize <= (int)uVar5) goto LAB_0033a526;
            uVar15 = (p->vObjFin0).pArray[uVar5] + iVar11;
            if ((int)uVar15 < 1) goto LAB_0033a56d;
            if ((p->vFinFon).nSize <= (int)uVar15) goto LAB_0033a526;
            piVar3 = (p->vFinFon).pArray;
            if (piVar3[uVar15] != 0) {
              pcVar13 = "Cba_ObjFinFon(p, i, k)== 0";
              goto LAB_0033a5bb;
            }
            piVar3[uVar15] = iVar14;
            uVar12 = uVar12 + 1;
            iVar11 = iVar11 + 1;
            if ((pSyn->vObjFin0).nSize <= lVar10) goto LAB_0033a526;
          }
          iVar11 = (pSyn->vObjType).nSize;
          lVar10 = (long)iVar11;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < lVar10);
    }
  }
  uVar5 = (p->vFonObj).nCap;
  if ((p->vFonCopy).nCap < (int)uVar5) {
    piVar7 = (p->vFonCopy).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar5 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar5 << 2);
    }
    (p->vFonCopy).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
LAB_0033a6dd:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vFonCopy).nCap = uVar5;
  }
  if (0 < (int)uVar5) {
    memset((p->vFonCopy).pArray,0,(ulong)uVar5 * 4);
  }
  (p->vFonCopy).nSize = uVar5;
  if (0 < (p->vFonName).nSize) {
    Vec_IntFillExtra(&p->vFonName,(p->vFonObj).nSize,0);
  }
  if ((pSyn->vOutputs).nSize < 1) {
    piVar7 = __ptr->pArray;
    if (piVar7 == (int *)0x0) goto LAB_0033a4ab;
  }
  else {
    pVVar6 = &p->vFonName;
    uVar9 = 0;
    uVar12 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar12 = uVar9;
    }
    do {
      iVar11 = (pSyn->vOutputs).pArray[uVar9];
      if ((long)iVar11 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x16b,"int Cba_ObjFinFon(Cba_Ntk_t *, int, int)");
      }
      if ((pSyn->vObjFin0).nSize <= iVar11) goto LAB_0033a526;
      iVar11 = (pSyn->vObjFin0).pArray[iVar11];
      if ((long)iVar11 < 1) {
LAB_0033a56d:
        __assert_fail("f>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
      }
      if ((pSyn->vFinFon).nSize <= iVar11) goto LAB_0033a526;
      iVar11 = (pSyn->vFinFon).pArray[iVar11];
      lVar16 = (long)iVar11;
      if (lVar16 < 1) {
LAB_0033a5d3:
        __assert_fail("Cba_FonIsReal(Cba_FonCopy(pSyn, iFon))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                      ,0x476,"void Cba_NtkInsertGroup(Cba_Ntk_t *, Vec_Int_t *, Cba_Ntk_t *)");
      }
      if ((pSyn->vFonCopy).nSize <= iVar11) goto LAB_0033a526;
      piVar3 = (pSyn->vFonCopy).pArray;
      iVar14 = piVar3[lVar16];
      if (iVar14 < 1) goto LAB_0033a5d3;
      if (uVar12 == uVar9) goto LAB_0033a526;
      piVar7 = __ptr->pArray;
      lVar10 = (long)piVar7[uVar9];
      if (lVar10 < 1) goto LAB_0033a545;
      if ((p->vFonCopy).nSize <= piVar7[uVar9]) goto LAB_0033a526;
      piVar4 = (p->vFonCopy).pArray;
      if (piVar4[lVar10] != 0) goto LAB_0033a54e;
      piVar4[lVar10] = iVar14;
      if (0 < (p->vFonName).nSize) {
        if ((pSyn->vFonCopy).nSize <= iVar11) goto LAB_0033a526;
        iVar11 = piVar7[uVar9];
        if ((long)iVar11 < 1) {
          __assert_fail("Cba_FonIsReal(f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x18a,"int Cba_FonName(Cba_Ntk_t *, int)");
        }
        iVar14 = piVar3[lVar16];
        Vec_IntFillExtra(pVVar6,iVar11 + 1,0);
        if ((p->vFonName).nSize <= iVar11) goto LAB_0033a526;
        Cba_FonSetName(p,iVar14,(p->vFonName).pArray[iVar11]);
        if ((p->vFonName).nSize < 1) {
          pcVar13 = "Cba_NtkHasFonNames(p)";
LAB_0033a6a6:
          __assert_fail(pcVar13,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x18d,"void Cba_FonCleanName(Cba_Ntk_t *, int)");
        }
        uVar5 = piVar7[uVar9];
        if ((int)uVar5 < 1) {
          pcVar13 = "Cba_FonIsReal(f)";
          goto LAB_0033a6a6;
        }
        Vec_IntFillExtra(pVVar6,uVar5 + 1,0);
        if ((p->vFonName).nSize <= (int)uVar5) goto LAB_0033a526;
        if ((p->vFonName).pArray[uVar5] == 0) {
          pcVar13 = "Cba_FonName(p, f) != 0";
          goto LAB_0033a6a6;
        }
        Vec_IntFillExtra(pVVar6,uVar5 + 1,0);
        if ((p->vFonName).nSize <= (int)uVar5) goto LAB_0033a64f;
        (p->vFonName).pArray[uVar5] = 0;
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)(pSyn->vOutputs).nSize);
  }
  free(piVar7);
LAB_0033a4ab:
  free(__ptr);
  iVar11 = (p->vFinFon).nSize;
  if (1 < iVar11) {
    piVar7 = (p->vFinFon).pArray;
    lVar16 = 1;
    do {
      iVar14 = piVar7[lVar16];
      if (0 < (long)iVar14) {
        if ((p->vFonCopy).nSize <= iVar14) {
LAB_0033a526:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar14 = (p->vFonCopy).pArray[iVar14];
        if (iVar14 != 0) {
          if (iVar11 <= lVar16) {
LAB_0033a64f:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar7[lVar16] = iVar14;
          iVar11 = (p->vFinFon).nSize;
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar11);
  }
  Cba_NtkMissingFonNames(p,"j");
  return;
LAB_0033a545:
  pcVar13 = "Cba_FonIsReal(f)";
  goto LAB_0033a555;
LAB_0033a54e:
  pcVar13 = "Cba_FonCopy(p, f) == 0";
LAB_0033a555:
  __assert_fail(pcVar13,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                ,0x189,"void Cba_FonSetCopy(Cba_Ntk_t *, int, int)");
}

Assistant:

void Cba_NtkInsertGroup( Cba_Ntk_t * p, Vec_Int_t * vObjs, Cba_Ntk_t * pSyn )
{
    Vec_Int_t * vFonIns  = Cba_NtkCollectInFons( p, vObjs );
    Vec_Int_t * vFonOuts = Cba_NtkCollectOutFons( p, vObjs );
    int k, iObj, iObjNew, iFin, iFon;
    assert( Cba_NtkPiNum(pSyn) == Vec_IntSize(vFonIns) );
    assert( Cba_NtkPoNum(pSyn) == Vec_IntSize(vFonOuts) );
    // mark AIG with the input fons
    Cba_NtkCleanFonCopies( pSyn );
    Cba_NtkForEachPiFon( pSyn, iObj, iFon, k )
        Cba_FonSetCopy( pSyn, iFon, Vec_IntEntry(vFonIns, k) );
    Vec_IntFree( vFonIns );
    // build up internal nodes
    Cba_NtkCleanObjCopies( pSyn );
    Cba_NtkForEachBox( pSyn, iObj )
    {
        iObjNew = Cba_ObjDup( p, pSyn, iObj );
        Cba_ObjForEachFon( pSyn, iObj, iFon, k )
            Cba_FonSetCopy( pSyn, iFon, Cba_ObjFon(p, iObjNew, k) );
    }
    // connect internal nodes
    Cba_NtkForEachBox( pSyn, iObj )
    {
        iObjNew = Cba_ObjCopy( pSyn, iObj );
        Cba_ObjForEachFinFon( pSyn, iObj, iFin, iFon, k )
            Cba_ObjSetFinFon( p, iObjNew, k, Cba_FonCopy(pSyn, iFon) );
    }
    // connect output fons
    Cba_NtkCleanFonCopies( p );
    if ( Cba_NtkHasFonNames(p) )
        Vec_IntFillExtra( &p->vFonName, Cba_NtkFonNum(p) + 1, 0 );
    Cba_NtkForEachPoDriverFon( pSyn, iObj, iFon, k )
    {
        assert( Cba_FonIsReal(Cba_FonCopy(pSyn, iFon)) );
        Cba_FonSetCopy( p, Vec_IntEntry(vFonOuts, k), Cba_FonCopy(pSyn, iFon) );
        // transfer names
        if ( Cba_NtkHasFonNames(p) )
        {
            Cba_FonSetName( p, Cba_FonCopy(pSyn, iFon), Cba_FonName(p, Vec_IntEntry(vFonOuts, k)) );
            Cba_FonCleanName( p, Vec_IntEntry(vFonOuts, k) );
        }
    }
    Vec_IntFree( vFonOuts );
    // delete nodes
//    Vec_IntForEachEntry( vObjs, iObj, k )
//        Cba_ObjDelete( p, iObj );
    // update fins pointing to output fons to point to the new fons
    Cba_NtkForEachFinFon( p, iFon, iFin )
        if ( Cba_FonIsReal(iFon) && Cba_FonCopy(p, iFon) )
            Cba_PatchFinFon( p, iFin, Cba_FonCopy(p, iFon) );
    Cba_NtkMissingFonNames( p, "j" );
/*
    // duplicate in DFS order
    pNew = Cba_NtkDupOrder( p->pDesign, p, Cba_NtkCollectDfs );
    Cba_NtkDupAttrs( pNew, p );
    // replace "p" with "pNew"
    Cba_NtkUpdate( Cba_NtkMan(p), pNew ); // removes "p"
    return pNew;
*/
}